

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int SetCropWindow(VP8Io *io,int y_start,int y_end,uint8_t **in_data,int pixel_stride)

{
  int delta;
  int pixel_stride_local;
  uint8_t **in_data_local;
  int y_end_local;
  int y_start_local;
  VP8Io *io_local;
  uint local_4;
  
  y_end_local = y_end;
  if (io->crop_bottom < y_end) {
    y_end_local = io->crop_bottom;
  }
  y_start_local = y_start;
  if (y_start < io->crop_top) {
    y_start_local = io->crop_top;
    *in_data = *in_data + (io->crop_top - y_start) * pixel_stride;
  }
  if (y_start_local < y_end_local) {
    *in_data = *in_data + (long)io->crop_left * 4;
    io->mb_y = y_start_local - io->crop_top;
    io->mb_w = io->crop_right - io->crop_left;
    io->mb_h = y_end_local - y_start_local;
  }
  local_4 = (uint)(y_start_local < y_end_local);
  return local_4;
}

Assistant:

static int SetCropWindow(VP8Io* const io, int y_start, int y_end,
                         uint8_t** const in_data, int pixel_stride) {
  assert(y_start < y_end);
  assert(io->crop_left < io->crop_right);
  if (y_end > io->crop_bottom) {
    y_end = io->crop_bottom;  // make sure we don't overflow on last row.
  }
  if (y_start < io->crop_top) {
    const int delta = io->crop_top - y_start;
    y_start = io->crop_top;
    *in_data += delta * pixel_stride;
  }
  if (y_start >= y_end) return 0;  // Crop window is empty.

  *in_data += io->crop_left * sizeof(uint32_t);

  io->mb_y = y_start - io->crop_top;
  io->mb_w = io->crop_right - io->crop_left;
  io->mb_h = y_end - y_start;
  return 1;  // Non-empty crop window.
}